

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::TemplatedColumnDataCopy<duckdb::StructValueCopy>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t count)

{
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar1;
  reference pvVar2;
  ColumnDataAllocator *this_00;
  idx_t i;
  long lVar3;
  idx_t row_idx;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  VectorDataIndex prev_index;
  bool bVar7;
  ValidityMask result_validity;
  idx_t local_88;
  TemplatedValidityMask<unsigned_long> local_50;
  
  this = meta_data->segment;
  state = meta_data->state;
  prev_index.index = (meta_data->vector_data_index).index;
  local_88 = offset;
  while (count != 0) {
    pvVar2 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
    uVar4 = (ulong)(0x800 - pvVar2->count);
    if (count <= uVar4) {
      uVar4 = count;
    }
    this_00 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
    local_50.validity_mask =
         (unsigned_long *)
         ColumnDataAllocator::GetDataPointer
                   (this_00,&state->current_chunk_state,pvVar2->block_id,pvVar2->offset);
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.capacity = 0x800;
    if (pvVar2->count == 0) {
      TemplatedValidityMask<unsigned_long>::SetAllValid(&local_50,0x800);
    }
    if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      lVar3 = 0;
      uVar5 = uVar4;
      iVar6 = local_88;
      while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
        psVar1 = source_data->sel->sel_vector;
        row_idx = iVar6;
        if (psVar1 != (sel_t *)0x0) {
          row_idx = (idx_t)psVar1[iVar6];
        }
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(source_data->validity).super_TemplatedValidityMask<unsigned_long>,
                           row_idx);
        if (!bVar7) {
          TemplatedValidityMask<unsigned_long>::SetInvalid(&local_50,(ulong)pvVar2->count + lVar3);
        }
        lVar3 = lVar3 + 1;
        iVar6 = iVar6 + 1;
      }
    }
    pvVar2->count = pvVar2->count + (short)uVar4;
    count = count - uVar4;
    if (count != 0) {
      if ((pvVar2->next_data).index == 0xffffffffffffffff) {
        ColumnDataCollectionSegment::AllocateVector
                  (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index);
      }
      pvVar2 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
      prev_index.index = (pvVar2->next_data).index;
    }
    local_88 = local_88 + uVar4;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

static void TemplatedColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data,
                                    Vector &source, idx_t offset, idx_t count) {
	auto &segment = meta_data.segment;
	auto &append_state = meta_data.state;

	auto current_index = meta_data.vector_data_index;
	idx_t remaining = count;
	while (remaining > 0) {
		auto &current_segment = segment.GetVectorData(current_index);
		idx_t append_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE - current_segment.count, remaining);

		auto base_ptr = segment.allocator->GetDataPointer(append_state.current_chunk_state, current_segment.block_id,
		                                                  current_segment.offset);
		auto validity_data = ColumnDataCollectionSegment::GetValidityPointerForWriting(base_ptr, OP::TypeSize());

		ValidityMask result_validity(validity_data, STANDARD_VECTOR_SIZE);
		if (current_segment.count == 0) {
			// first time appending to this vector
			// all data here is still uninitialized
			// initialize the validity mask to set all to valid
			result_validity.SetAllValid(STANDARD_VECTOR_SIZE);
		}
		if (source_data.validity.AllValid()) {
			// Fast path: all valid
			for (idx_t i = 0; i < append_count; i++) {
				auto source_idx = source_data.sel->get_index(offset + i);
				OP::template Assign<OP>(meta_data, base_ptr, source_data.data, current_segment.count + i, source_idx);
			}
		} else {
			for (idx_t i = 0; i < append_count; i++) {
				auto source_idx = source_data.sel->get_index(offset + i);
				if (source_data.validity.RowIsValid(source_idx)) {
					OP::template Assign<OP>(meta_data, base_ptr, source_data.data, current_segment.count + i,
					                        source_idx);
				} else {
					result_validity.SetInvalid(current_segment.count + i);
				}
			}
		}
		current_segment.count += append_count;
		offset += append_count;
		remaining -= append_count;
		if (remaining > 0) {
			// need to append more, check if we need to allocate a new vector or not
			if (!current_segment.next_data.IsValid()) {
				segment.AllocateVector(source.GetType(), meta_data.chunk_data, append_state, current_index);
			}
			D_ASSERT(segment.GetVectorData(current_index).next_data.IsValid());
			current_index = segment.GetVectorData(current_index).next_data;
		}
	}
}